

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

int lws_ssl_capable_read_no_ssl(lws *wsi,uchar *buf,int len)

{
  lws_udp *__addr;
  uint uVar1;
  int *piVar2;
  ssize_t sVar3;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  __addr = wsi->udp;
  if (__addr == (lws_udp *)0x0) {
    sVar3 = recv((wsi->desc).sockfd,buf,(long)len,0);
    uVar1 = (uint)sVar3;
  }
  else {
    __addr->salen = 0x10;
    sVar3 = recvfrom((wsi->desc).sockfd,buf,(long)len,0,(sockaddr *)__addr,&__addr->salen);
    uVar1 = (uint)sVar3;
  }
  if ((int)uVar1 < 0) {
    uVar1 = 0xfffffffc;
    if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
      _lws_log(8,"error on reading from skt : %d\n");
      uVar1 = 0xffffffff;
    }
  }
  else {
    uVar1 = -(uint)(uVar1 == 0) | uVar1;
  }
  return uVar1;
}

Assistant:

int
lws_ssl_capable_read_no_ssl(struct lws *wsi, unsigned char *buf, int len)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n = 0;

	lws_stats_bump(pt, LWSSTATS_C_API_READ, 1);

	errno = 0;
#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		wsi->udp->salen = sizeof(wsi->udp->sa);
		n = recvfrom(wsi->desc.sockfd, (char *)buf, len, 0,
			     &wsi->udp->sa, &wsi->udp->salen);
	} else
#endif
		n = recv(wsi->desc.sockfd, (char *)buf, len, 0);

	if (n >= 0) {

		if (!n && wsi->unix_skt)
			return LWS_SSL_CAPABLE_ERROR;

		/*
		 * See https://libwebsockets.org/
		 * pipermail/libwebsockets/2019-March/007857.html
		 */
		if (!n)
			return LWS_SSL_CAPABLE_ERROR;

#if defined(LWS_WITH_SERVER_STATUS)
		if (wsi->vhost)
			wsi->vhost->conn_stats.rx += n;
#endif
		lws_stats_bump(pt, LWSSTATS_B_READ, n);

		return n;
	}

	if (LWS_ERRNO == LWS_EAGAIN ||
	    LWS_ERRNO == LWS_EWOULDBLOCK ||
	    LWS_ERRNO == LWS_EINTR)
		return LWS_SSL_CAPABLE_MORE_SERVICE;

	lwsl_info("error on reading from skt : %d\n", LWS_ERRNO);
	return LWS_SSL_CAPABLE_ERROR;
}